

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzstrmatrixot.cpp
# Opt level: O2

void __thiscall
TPZStructMatrixOT<std::complex<double>_>::Serial_Assemble
          (TPZStructMatrixOT<std::complex<double>_> *this,TPZBaseMatrix *stiff_base,
          TPZBaseMatrix *rhs_base,TPZAutoPointer<TPZGuiInterface> *guiInterface)

{
  TPZManVector<long,_10> *orig;
  TPZCompMesh *mesh;
  TPZCompEl *pTVar1;
  TPZGuiInterface *this_00;
  char cVar2;
  bool bVar3;
  int iVar4;
  long lVar5;
  TPZStructMatrix *this_01;
  ostream *poVar6;
  TPZCompEl **ppTVar7;
  long *plVar8;
  long *plVar9;
  TPZFMatrix<std::complex<double>_> *rhs;
  allocator<char> aStack_104f1;
  TPZStructMatrixOT<std::complex<double>_> *pTStack_104f0;
  long lStack_104e8;
  long *plStack_104e0;
  TPZEquationFilter *pTStack_104d8;
  long lStack_104d0;
  set<int,_std::less<int>,_std::allocator<int>_> *psStack_104c8;
  TPZFMatrix<std::complex<double>_> *pTStack_104c0;
  TPZFNMatrix<1000,_std::complex<double>_> *pTStack_104b8;
  TPZFMatrix<std::complex<double>_> *pTStack_104b0;
  TPZFMatrix<std::complex<double>_> *pTStack_104a8;
  TPZFNMatrix<1000,_std::complex<double>_> *pTStack_104a0;
  TPZAutoPointer<TPZGuiInterface> *pTStack_10498;
  string sStack_10490;
  string sStack_10470;
  TPZTimer assemble;
  TPZTimer calcstiff;
  TPZElementMatrixT<std::complex<double>_> ek;
  TPZElementMatrixT<std::complex<double>_> ef;
  
  pTStack_104f0 = this;
  pTStack_10498 = guiInterface;
  lVar5 = __dynamic_cast(stiff_base,&TPZBaseMatrix::typeinfo,
                         &TPZMatrix<std::complex<double>>::typeinfo,0);
  if ((lVar5 == 0) ||
     (lVar5 = __dynamic_cast(rhs_base,&TPZBaseMatrix::typeinfo,
                             &TPZFMatrix<std::complex<double>>::typeinfo,0), lVar5 == 0)) {
    std::operator<<((ostream *)&std::cerr,
                    "virtual void TPZStructMatrixOT<std::complex<double>>::Serial_Assemble(TPZBaseMatrix &, TPZBaseMatrix &, TPZAutoPointer<TPZGuiInterface>) [TVar = std::complex<double>]"
                   );
    std::operator<<((ostream *)&std::cerr,": incompatible types. Aborting...\n");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/StrMatrix/pzstrmatrixot.cpp"
               ,0xd0);
  }
  this_01 = (TPZStructMatrix *)
            __dynamic_cast(pTStack_104f0,&TPZStructMatrixOT<std::complex<double>>::typeinfo,
                           &::TPZStructMatrix::typeinfo,0xfffffffffffffffe);
  mesh = this_01->fMesh;
  plStack_104e0 =
       (long *)__dynamic_cast(stiff_base,&TPZBaseMatrix::typeinfo,
                              &TPZMatrix<std::complex<double>>::typeinfo,0);
  if ((plStack_104e0 == (long *)0x0) ||
     (pTStack_104b0 =
           (TPZFMatrix<std::complex<double>_> *)
           __dynamic_cast(rhs_base,&TPZBaseMatrix::typeinfo,
                          &TPZFMatrix<std::complex<double>>::typeinfo,0),
     pTStack_104b0 == (TPZFMatrix<std::complex<double>_> *)0x0)) {
    __cxa_bad_cast();
  }
  if (mesh == (TPZCompMesh *)0x0) {
    poVar6 = std::operator<<((ostream *)&std::cout,"Serial_Assemble called without mesh");
    std::endl<char,std::char_traits<char>>(poVar6);
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/StrMatrix/pzstrmatrixot.cpp"
               ,0xdb);
  }
  lVar5 = (mesh->fElementVec).super_TPZChunkVector<TPZCompEl_*,_10>.fNElements;
  TPZElementMatrixT<std::complex<double>_>::TPZElementMatrixT(&ek,mesh,EK);
  TPZElementMatrixT<std::complex<double>_>::TPZElementMatrixT(&ef,mesh,EF);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&sStack_10470,"Computing the stiffness matrices",(allocator<char> *)&assemble
            );
  TPZTimer::TPZTimer(&calcstiff,&sStack_10470);
  std::__cxx11::string::~string((string *)&sStack_10470);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&sStack_10490,"Assembling the stiffness matrices",&aStack_104f1);
  TPZTimer::TPZTimer(&assemble,&sStack_10490);
  pTStack_104d8 = &this_01->fEquationFilter;
  psStack_104c8 = &this_01->fMaterialIds;
  std::__cxx11::string::~string((string *)&sStack_10490);
  orig = &ek.super_TPZElementMatrix.fSourceIndex;
  pTStack_104a0 = &ek.fConstrMat;
  pTStack_104a8 = &ef.fConstrMat.super_TPZFMatrix<std::complex<double>_>;
  pTStack_104b8 = &ek.fMat;
  pTStack_104c0 = &ef.fMat.super_TPZFMatrix<std::complex<double>_>;
  lStack_104e8 = 0;
  if (lVar5 < 1) {
    lVar5 = 0;
  }
  for (lStack_104d0 = 0; lVar5 != lStack_104d0; lStack_104d0 = lStack_104d0 + 1) {
    ppTVar7 = TPZChunkVector<TPZCompEl_*,_10>::operator[]
                        (&(mesh->fElementVec).super_TPZChunkVector<TPZCompEl_*,_10>,lStack_104d0);
    pTVar1 = *ppTVar7;
    if (pTVar1 != (TPZCompEl *)0x0) {
      if ((int)(this_01->fMaterialIds)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
        plVar8 = (long *)(**(code **)(*(long *)pTVar1 + 0xb8))(pTVar1);
        plVar9 = (long *)__dynamic_cast(pTVar1,&TPZCompEl::typeinfo,&TPZSubCompMesh::typeinfo,0x918)
        ;
        if (plVar8 == (long *)0x0) {
          if (plVar9 == (long *)0x0) goto LAB_011a9d7f;
          cVar2 = (**(code **)(*plVar9 + 0x140))(plVar9,psStack_104c8);
        }
        else {
          iVar4 = (**(code **)(*plVar8 + 0x58))(plVar8);
          cVar2 = ::TPZStructMatrix::ShouldCompute(this_01,iVar4);
        }
        if (cVar2 == '\0') goto LAB_011a9d7f;
      }
      lStack_104e8 = lStack_104e8 + 1;
      if (lStack_104e8 % 1000 == 0) {
        std::operator<<((ostream *)&std::cout,'*');
        std::ostream::flush();
      }
      if (lStack_104e8 % 20000 == 0) {
        std::operator<<((ostream *)&std::cout,"\n");
      }
      TPZTimer::start(&calcstiff);
      (**(code **)(*(long *)pTVar1 + 0x110))(pTVar1,&ek,&ef);
      if (((pTStack_10498->fRef != (TPZReference *)0x0) &&
          (this_00 = pTStack_10498->fRef->fPointer, this_00 != (TPZGuiInterface *)0x0)) &&
         (bVar3 = TPZGuiInterface::AmIKilled(this_00), bVar3)) break;
      TPZTimer::stop(&calcstiff);
      TPZTimer::start(&assemble);
      iVar4 = (**(code **)(*(long *)pTVar1 + 0x1f0))(pTVar1);
      if (iVar4 == 0) {
        TPZElementMatrix::ComputeDestinationIndices(&ek.super_TPZElementMatrix);
        TPZEquationFilter::Filter
                  (pTStack_104d8,&orig->super_TPZVec<long>,
                   &ek.super_TPZElementMatrix.fDestinationIndex.super_TPZVec<long>);
        (**(code **)(*plStack_104e0 + 0x1a0))
                  (plStack_104e0,pTStack_104b8,orig,&ek.super_TPZElementMatrix.fDestinationIndex);
        rhs = pTStack_104c0;
        if (*(char *)((long)&(pTStack_104f0->fElBlocked)._vptr_TPZVec +
                     *(long *)(*(long *)pTStack_104f0 + -0x60) + 4) != '\0') goto LAB_011a9d5d;
      }
      else {
        TPZElementMatrixT<std::complex<double>_>::ApplyConstraints(&ek);
        TPZElementMatrixT<std::complex<double>_>::ApplyConstraints(&ef);
        TPZElementMatrix::ComputeDestinationIndices(&ek.super_TPZElementMatrix);
        TPZEquationFilter::Filter
                  (pTStack_104d8,&orig->super_TPZVec<long>,
                   &ek.super_TPZElementMatrix.fDestinationIndex.super_TPZVec<long>);
        (**(code **)(*plStack_104e0 + 0x1a0))
                  (plStack_104e0,pTStack_104a0,orig,&ek.super_TPZElementMatrix.fDestinationIndex);
        rhs = pTStack_104a8;
        if (*(char *)((long)&(pTStack_104f0->fElBlocked)._vptr_TPZVec +
                     *(long *)(*(long *)pTStack_104f0 + -0x60) + 4) == '\x01') {
LAB_011a9d5d:
          TPZFMatrix<std::complex<double>_>::AddFel
                    (pTStack_104b0,rhs,&orig->super_TPZVec<long>,
                     &ek.super_TPZElementMatrix.fDestinationIndex.super_TPZVec<long>);
        }
      }
      TPZTimer::stop(&assemble);
    }
LAB_011a9d7f:
  }
  std::__cxx11::string::~string((string *)&assemble.ProcessName);
  std::__cxx11::string::~string((string *)&calcstiff.ProcessName);
  TPZElementMatrixT<std::complex<double>_>::~TPZElementMatrixT(&ef);
  TPZElementMatrixT<std::complex<double>_>::~TPZElementMatrixT(&ek);
  return;
}

Assistant:

void TPZStructMatrixOT<TVar>::Serial_Assemble(TPZBaseMatrix & stiff_base, TPZBaseMatrix & rhs_base, TPZAutoPointer<TPZGuiInterface> guiInterface ){
    if(!dynamic_cast<TPZMatrix<TVar>*>(&stiff_base)||
       !dynamic_cast<TPZFMatrix<TVar>*>(&rhs_base)){
        PZError<<__PRETTY_FUNCTION__;
        PZError<<": incompatible types. Aborting...\n";
        DebugStop();
    }
    auto *myself = dynamic_cast<TPZStructMatrix*>(this);
    auto *cmesh = myself->Mesh();
    const auto &equationFilter = myself->EquationFilter();
    auto &materialIds = myself->MaterialIds();
    
    auto &stiffness = dynamic_cast<TPZMatrix<TVar>&>(stiff_base);
    auto &rhs = dynamic_cast<TPZFMatrix<TVar>&>(rhs_base);
    if(!cmesh){
        LOGPZ_ERROR(logger,"Serial_Assemble called without mesh")
        DebugStop();
    }
#ifdef PZ_LOG
    if(dynamic_cast<TPZSubCompMesh * >(cmesh))
    {
        std::stringstream sout;
        sout << "AllEig = {};";
        LOGPZ_DEBUG(loggerelmat,sout.str())
        
    }
#endif
#ifdef PZDEBUG
    if (ComputeRhs() && rhs.Rows() != equationFilter.NActiveEquations()) {
        DebugStop();
    }
#endif
    
    int64_t iel;
    int64_t nelem = cmesh->NElements();
    TPZElementMatrixT<TVar> ek(cmesh, TPZElementMatrix::EK),ef(cmesh, TPZElementMatrix::EF);
#ifdef PZ_LOG
    bool globalresult = true;
    bool writereadresult = true;
#endif
    TPZTimer calcstiff("Computing the stiffness matrices");
    TPZTimer assemble("Assembling the stiffness matrices");
    TPZAdmChunkVector<TPZCompEl *> &elementvec = cmesh->ElementVec();
    
    int64_t count = 0;
    for(iel=0; iel < nelem; iel++) {
        TPZCompEl *el = elementvec[iel];
        if(!el) continue;
        int matidsize = materialIds.size();
        if(matidsize){
            TPZMaterial * mat = el->Material();
            TPZSubCompMesh *submesh = dynamic_cast<TPZSubCompMesh *> (el);
            if (!mat)
            {
                if (!submesh) {
                    continue;
                }
                else if(submesh->NeedsComputing(materialIds) == false) continue;
            }
            else
            {
                int matid = mat->Id();
                if (myself->ShouldCompute(matid) == false) continue;
            }
        }
        
        count++;
        if(!(count%1000))
        {
            std::cout << '*';
            std::cout.flush();
        }
        if(!(count%20000))
        {
            std::cout << "\n";
        }
        calcstiff.start();
        
        el->CalcStiff(ek,ef);
        
        if(guiInterface) if(guiInterface->AmIKilled()){
            return;
        }
        
#ifdef PZ_LOG
        if(dynamic_cast<TPZSubCompMesh * >(cmesh))
        {
            std::stringstream objname;
            objname << "Element" << iel;
            std::string name = objname.str();
            objname << " = ";
            std::stringstream sout;
            ek.fMat.Print(objname.str().c_str(),sout,EMathematicaInput);
            sout << "AppendTo[AllEig,Eigenvalues[" << name << "]];";
            
            LOGPZ_DEBUG(loggerelmat,sout.str())
            /*		  if(iel == 133)
             {
             std::stringstream sout2;
             el->Reference()->Print(sout2);
             el->Print(sout2);
             LOGPZ_DEBUG(logger,sout2.str())
             }
             */
        }
        
#endif
        
#ifdef CHECKCONSISTENCY
        //extern TPZCheckConsistency stiffconsist("ElementStiff");
        stiffconsist.SetOverWrite(true);
        bool result;
        result = stiffconsist.CheckObject(ek.fMat);
        if(!result)
        {
            globalresult = false;
            std::stringstream sout;
            sout << "element " << iel << " computed differently";
            LOGPZ_ERROR(loggerCheck,sout.str())
        }
        
#endif
        
        calcstiff.stop();
        assemble.start();
        
        if(!el->HasDependency()) {
            ek.ComputeDestinationIndices();
            equationFilter.Filter(ek.fSourceIndex, ek.fDestinationIndex);
            //			TPZSFMatrix<TVar> test(stiffness);
            //			TPZFMatrix<TVar> test2(stiffness.Rows(),stiffness.Cols(),0.);
            //			stiffness.Print("before assembly",std::cout,EMathematicaInput);
            stiffness.AddKel(ek.fMat,ek.fSourceIndex,ek.fDestinationIndex);
            if(ComputeRhs())rhs.AddFel(ef.fMat,ek.fSourceIndex,ek.fDestinationIndex);
            //			stiffness.Print("stiffness after assembly STK = ",std::cout,EMathematicaInput);
            //			rhs.Print("rhs after assembly Rhs = ",std::cout,EMathematicaInput);
            //			test2.AddKel(ek.fMat,ek.fSourceIndex,ek.fDestinationIndex);
            //			test -= stiffness;
            //			test.Print("matriz de rigidez diference",std::cout);
            //			test2.Print("matriz de rigidez interface",std::cout);
            
#ifdef PZ_LOG
            if(loggerel.isDebugEnabled())
            {
                std::stringstream sout;
                TPZGeoEl *gel = el->Reference();
                if(gel)
                {
                    TPZManVector<REAL> center(gel->Dimension()),xcenter(3,0.);
                    gel->CenterPoint(gel->NSides()-1, center);
                    gel->X(center, xcenter);
                    sout << "Stiffness for computational element index " << el->Index() << std::endl;
                    sout << "Stiffness for geometric element " << gel->Index() << " center " << xcenter << std::endl;
                }
                else {
                    sout << "Stiffness for computational element without associated geometric element\n";
                }
                ek.Print(sout);
                if(ComputeRhs())ef.Print(sout);
                LOGPZ_DEBUG(loggerel,sout.str())
            }
#endif
        } else {
            // the element has dependent nodes
            ek.ApplyConstraints();
            ef.ApplyConstraints();
            ek.ComputeDestinationIndices();
            equationFilter.Filter(ek.fSourceIndex, ek.fDestinationIndex);
            stiffness.AddKel(ek.fConstrMat,ek.fSourceIndex,ek.fDestinationIndex);
            if(ComputeRhs())rhs.AddFel(ef.fConstrMat,ek.fSourceIndex,ek.fDestinationIndex);
#ifdef PZ_LOG
            if(loggerel.isDebugEnabled() && ! dynamic_cast<TPZSubCompMesh *>(cmesh))
            {
                std::stringstream sout;
                TPZGeoEl *gel = el->Reference();
                TPZManVector<REAL> center(gel->Dimension()),xcenter(3,0.);
                gel->CenterPoint(gel->NSides()-1, center);
                gel->X(center, xcenter);
                sout << "Stiffness for geometric element " << gel->Index() << " center " << xcenter << std::endl;
                ek.Print(sout);
                ef.Print(sout);
                LOGPZ_DEBUG(loggerel,sout.str())
            }
#endif
        }
        
        assemble.stop();
    }//fim for iel
    
#ifdef PZ_LOG
    if(loggerCheck.isDebugEnabled())
    {
        std::stringstream sout;
        sout << "The comparaison results are : consistency check " << globalresult << " write read check " << writereadresult;
        //stiffness.Print("Matriz de Rigidez: ",sout);
        stiffness.Print("Matriz de Rigidez: ",sout,EMathematicaInput);
        if(ComputeRhs()) rhs.Print("Right Handside", sout,EMathematicaInput);
        LOGPZ_DEBUG(loggerCheck,sout.str())
    }
    
#endif
    
}